

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

QPDFEFStreamObjectHelper *
QPDFEFStreamObjectHelper::createEFStream
          (QPDFEFStreamObjectHelper *__return_storage_ptr__,QPDF *qpdf,shared_ptr<Buffer> *data)

{
  shared_ptr<Buffer> local_40;
  QPDFObjectHandle local_30;
  shared_ptr<Buffer> *local_20;
  shared_ptr<Buffer> *data_local;
  QPDF *qpdf_local;
  
  local_20 = data;
  data_local = (shared_ptr<Buffer> *)qpdf;
  qpdf_local = (QPDF *)__return_storage_ptr__;
  std::shared_ptr<Buffer>::shared_ptr(&local_40,data);
  QPDF::newStream((QPDF *)&local_30,(shared_ptr<Buffer> *)qpdf);
  newFromStream(__return_storage_ptr__,&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  std::shared_ptr<Buffer>::~shared_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

QPDFEFStreamObjectHelper
QPDFEFStreamObjectHelper::createEFStream(QPDF& qpdf, std::shared_ptr<Buffer> data)
{
    return newFromStream(qpdf.newStream(data));
}